

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_newproxy(lua_State *L)

{
  int iVar1;
  int local_1c;
  int validproxy;
  lua_State *L_local;
  
  lua_settop(L,1);
  lua_newuserdata(L,0);
  iVar1 = lua_toboolean(L,1);
  if (iVar1 != 0) {
    iVar1 = lua_type(L,1);
    if (iVar1 == 1) {
      lua_createtable(L,0,0);
      lua_pushvalue(L,-1);
      lua_pushboolean(L,1);
      lua_rawset(L,-0x2713);
    }
    else {
      local_1c = 0;
      iVar1 = lua_getmetatable(L,1);
      if (iVar1 != 0) {
        lua_rawget(L,-0x2713);
        local_1c = lua_toboolean(L,-1);
        lua_settop(L,-2);
      }
      if (local_1c == 0) {
        luaL_argerror(L,1,"boolean or proxy expected");
      }
      lua_getmetatable(L,1);
    }
    lua_setmetatable(L,2);
  }
  return 1;
}

Assistant:

static int luaB_newproxy(lua_State*L){
lua_settop(L,1);
lua_newuserdata(L,0);
if(lua_toboolean(L,1)==0)
return 1;
else if(lua_isboolean(L,1)){
lua_newtable(L);
lua_pushvalue(L,-1);
lua_pushboolean(L,1);
lua_rawset(L,lua_upvalueindex(1));
}
else{
int validproxy=0;
if(lua_getmetatable(L,1)){
lua_rawget(L,lua_upvalueindex(1));
validproxy=lua_toboolean(L,-1);
lua_pop(L,1);
}
luaL_argcheck(L,validproxy,1,"boolean or proxy expected");
lua_getmetatable(L,1);
}
lua_setmetatable(L,2);
return 1;
}